

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_manager.cpp
# Opt level: O2

InvalidInputException *
duckdb::ErrorManager::InvalidUnicodeError
          (InvalidInputException *__return_storage_ptr__,string *input,string *context)

{
  UnicodeType UVar1;
  UnicodeInvalidReason reason;
  string base_message;
  size_t pos;
  UnicodeInvalidReason local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_t local_20;
  
  UVar1 = Utf8Proc::Analyze((input->_M_dataplus)._M_p,input->_M_string_length,&local_84,&local_20);
  if (UVar1 == INVALID) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    if ((local_84 == INVALID_UNICODE) || (local_84 == BYTE_MISMATCH)) {
      ::std::__cxx11::string::assign((char *)&local_80);
    }
    ::std::operator+(&local_60,&local_80," detected in ");
    ::std::operator+(&local_40,&local_60,context);
    InvalidInputException::InvalidInputException(__return_storage_ptr__,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    ::std::operator+(&local_80,"Invalid unicode error thrown but no invalid unicode detected in ",
                     context);
    InvalidInputException::InvalidInputException(__return_storage_ptr__,&local_80);
  }
  ::std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

InvalidInputException ErrorManager::InvalidUnicodeError(const string &input, const string &context) {
	UnicodeInvalidReason reason;
	size_t pos;
	auto unicode = Utf8Proc::Analyze(const_char_ptr_cast(input.c_str()), input.size(), &reason, &pos);
	if (unicode != UnicodeType::INVALID) {
		return InvalidInputException("Invalid unicode error thrown but no invalid unicode detected in " + context);
	}
	string base_message;
	switch (reason) {
	case UnicodeInvalidReason::BYTE_MISMATCH:
		base_message = "Invalid unicode (byte sequence mismatch)";
		break;
	case UnicodeInvalidReason::INVALID_UNICODE:
		base_message = "Invalid unicode";
		break;
	default:
		break;
	}
	return InvalidInputException(base_message + " detected in " + context);
}